

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

vector<Matrix<double>,_std::allocator<Matrix<double>_>_> * __thiscall
DataSet::compile(vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *__return_storage_ptr__,
                DataSet *this,uint n_output)

{
  reference pvVar1;
  uint end_col;
  Shape SVar2;
  uint uStack_13c;
  uint uStack_11c;
  Matrix<double> local_110;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  Matrix<double> local_90;
  allocator<Matrix<double>_> local_1e;
  undefined1 local_1d;
  uint local_1c;
  DataSet *pDStack_18;
  uint n_output_local;
  DataSet *this_local;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *matrices;
  
  local_1d = 0;
  local_1c = n_output;
  pDStack_18 = this;
  this_local = (DataSet *)__return_storage_ptr__;
  std::allocator<Matrix<double>_>::allocator(&local_1e);
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::vector
            (__return_storage_ptr__,2,&local_1e);
  std::allocator<Matrix<double>_>::~allocator(&local_1e);
  SVar2 = Matrix<double>::shape(&this->m_matrix);
  local_b0 = SVar2._0_8_;
  local_a8 = SVar2.is_diogonal;
  local_a0._4_4_ = SVar2.n_col;
  end_col = local_a0._4_4_ - local_1c;
  local_a0 = local_b0;
  local_98 = local_a8;
  Matrix<double>::compile(&local_90,&this->m_matrix,0,end_col);
  pvVar1 = std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::operator[]
                     (__return_storage_ptr__,0);
  Matrix<double>::operator=(pvVar1,&local_90);
  Matrix<double>::~Matrix(&local_90);
  SVar2 = Matrix<double>::shape(&this->m_matrix);
  uStack_11c = SVar2.n_col;
  uStack_11c = uStack_11c - local_1c;
  SVar2 = Matrix<double>::shape(&this->m_matrix);
  uStack_13c = SVar2.n_col;
  Matrix<double>::compile(&local_110,&this->m_matrix,uStack_11c,uStack_13c);
  pvVar1 = std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::operator[]
                     (__return_storage_ptr__,1);
  Matrix<double>::operator=(pvVar1,&local_110);
  Matrix<double>::~Matrix(&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Matrix_d> DataSet::compile(unsigned n_output) const{
    std::vector<Matrix_d> matrices(2);
    
    matrices[0]=m_matrix.compile(0, m_matrix.shape().n_col-n_output);
    matrices[1]=m_matrix.compile(m_matrix.shape().n_col-n_output, m_matrix.shape().n_col);

    return matrices;
}